

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Parser.cpp
# Opt level: O2

void __thiscall amrex::Parser::define(Parser *this,string *func_body)

{
  element_type *peVar1;
  element_type *peVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  YY_BUFFER_STATE b;
  amrex_parser *paVar4;
  string f;
  
  std::make_shared<amrex::Parser::Data>();
  std::__shared_ptr<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2> *)&f);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&f._M_string_length);
  if (func_body->_M_string_length != 0) {
    std::__cxx11::string::_M_assign
              ((string *)
               (this->m_data).super___shared_ptr<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    peVar1 = (this->m_data).super___shared_ptr<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    _Var3._M_current = (peVar1->m_expression)._M_dataplus._M_p;
    f._M_dataplus._M_p._0_1_ = 10;
    _Var3 = std::
            __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (_Var3,_Var3._M_current + (peVar1->m_expression)._M_string_length,
                       (_Iter_equals_val<const_char>)&f);
    peVar2 = (this->m_data).super___shared_ptr<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    std::__cxx11::string::erase
              (peVar1,_Var3._M_current,
               (peVar2->m_expression)._M_dataplus._M_p + (peVar2->m_expression)._M_string_length);
    std::operator+(&f,&((this->m_data).
                        super___shared_ptr<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->m_expression,"\n");
    b = amrex_parser_scan_string
                  ((char *)CONCAT71(f._M_dataplus._M_p._1_7_,f._M_dataplus._M_p._0_1_));
    amrex_parserparse();
    paVar4 = amrex_parser_new();
    ((this->m_data).super___shared_ptr<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    m_parser = paVar4;
    amrex_parser_delete_buffer(b);
    std::__cxx11::string::~string((string *)&f);
  }
  return;
}

Assistant:

void
Parser::define (std::string const& func_body)
{
    m_data = std::make_shared<Data>();

    if (!func_body.empty()) {
        m_data->m_expression = func_body;
        m_data->m_expression.erase(std::remove(m_data->m_expression.begin(),
                                               m_data->m_expression.end(),'\n'),
                                   m_data->m_expression.end());
        std::string f = m_data->m_expression + "\n";

        YY_BUFFER_STATE buffer = amrex_parser_scan_string(f.c_str());
        try {
            amrex_parserparse();
        } catch (const std::runtime_error& e) {
            throw std::runtime_error(std::string(e.what()) + " in Parser expression \""
                                     + m_data->m_expression + "\"");
        }
        m_data->m_parser = amrex_parser_new();
        amrex_parser_delete_buffer(buffer);
    }
}